

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O2

void helper_gvec_sar16v_s390x(void *d,void *a,void *b,uint32_t desc)

{
  ulong oprsz;
  ulong uVar1;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar1 = 0; uVar1 < oprsz; uVar1 = uVar1 + 2) {
    *(short *)((long)d + uVar1) =
         (short)((int)*(short *)((long)a + uVar1) >> (*(byte *)((long)b + uVar1) & 0xf));
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

void HELPER(gvec_sar16v)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int16_t)) {
        uint8_t sh = *(uint16_t *)((char *)b + i) & 15;
        *(int16_t *)((char *)d + i) = *(int16_t *)((char *)a + i) >> sh;
    }
    clear_high(d, oprsz, desc);
}